

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::CommandQueueVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::CommandQueueVkImpl>::operator=
          (RefCntAutoPtr<Diligent::CommandQueueVkImpl> *this,CommandQueueVkImpl *pObj)

{
  CommandQueueVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::CommandQueueVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (CommandQueueVkImpl *)0x0) {
      RefCountedObject<Diligent::ICommandQueueVk>::Release
                ((RefCountedObject<Diligent::ICommandQueueVk> *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (CommandQueueVkImpl *)0x0) {
      RefCountedObject<Diligent::ICommandQueueVk>::AddRef
                ((RefCountedObject<Diligent::ICommandQueueVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }